

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_set.h
# Opt level: O0

size_t __thiscall
spvtools::EnumSet<spvtools::Extension>::erase(EnumSet<spvtools::Extension> *this,Extension *value)

{
  Extension EVar1;
  Extension EVar2;
  value_type *pvVar3;
  value_type *pvVar4;
  reference pvVar5;
  __normal_iterator<const_spvtools::EnumSet<spvtools::Extension>::Bucket_*,_std::vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>_>
  local_48;
  Bucket *local_40;
  BucketType local_38;
  BucketType mask;
  value_type *bucket;
  size_t index;
  Extension *value_local;
  EnumSet<spvtools::Extension> *this_local;
  
  index = (size_t)value;
  value_local = (Extension *)this;
  pvVar3 = (value_type *)FindBucketForValue(this,*value);
  bucket = pvVar3;
  pvVar4 = (value_type *)
           std::
           vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
           ::size(&this->buckets_);
  if (pvVar3 < pvVar4) {
    pvVar5 = std::
             vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
             ::operator[](&this->buckets_,(size_type)bucket);
    EVar1 = pvVar5->start;
    EVar2 = ComputeBucketStart(*(Extension *)index);
    if (EVar1 == EVar2) {
      mask = (BucketType)
             std::
             vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
             ::operator[](&this->buckets_,(size_type)bucket);
      local_38 = ComputeMaskForValue(*(Extension *)index);
      if ((*(ulong *)mask & local_38) == 0) {
        return 0;
      }
      this->size_ = this->size_ - 1;
      *(BucketType *)mask = (local_38 ^ 0xffffffffffffffff) & *(ulong *)mask;
      if (*(long *)mask == 0) {
        local_48._M_current =
             (Bucket *)
             std::
             vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
             ::cbegin(&this->buckets_);
        local_40 = (Bucket *)
                   __gnu_cxx::
                   __normal_iterator<const_spvtools::EnumSet<spvtools::Extension>::Bucket_*,_std::vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>_>
                   ::operator+(&local_48,(difference_type)bucket);
        std::
        vector<spvtools::EnumSet<spvtools::Extension>::Bucket,_std::allocator<spvtools::EnumSet<spvtools::Extension>::Bucket>_>
        ::erase(&this->buckets_,(const_iterator)local_40);
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

size_t erase(const T& value) {
    const size_t index = FindBucketForValue(value);
    if (index >= buckets_.size() ||
        buckets_[index].start != ComputeBucketStart(value)) {
      return 0;
    }

    auto& bucket = buckets_[index];
    const auto mask = ComputeMaskForValue(value);
    if (!(bucket.data & mask)) {
      return 0;
    }

    size_ -= 1;
    bucket.data &= ~mask;
    if (bucket.data == 0) {
      buckets_.erase(buckets_.cbegin() + index);
    }
    return 1;
  }